

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAESDecodeStream.cpp
# Opt level: O2

void __thiscall
InputAESDecodeStream::Assign(InputAESDecodeStream *this,IByteReader *inSourceReader,ByteList *inKey)

{
  ulong uVar1;
  uchar *puVar2;
  long lVar3;
  _List_node_base *p_Var4;
  
  this->mSourceStream = inSourceReader;
  uVar1 = (inKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl._M_node.
          _M_size;
  this->mKeyLength = uVar1;
  puVar2 = (uchar *)operator_new__(uVar1);
  this->mKey = puVar2;
  lVar3 = 0;
  p_Var4 = (_List_node_base *)inKey;
  while (p_Var4 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var4 != (_List_node_base *)inKey
        ) {
    this->mKey[lVar3] = *(uchar *)&p_Var4[1]._M_next;
    lVar3 = lVar3 + 1;
  }
  aes_decrypt_key(this->mKey,(int)this->mKeyLength,(this->mDecrypt).cx);
  this->mReadBlockSize = '\x10';
  this->mIsIvInit = false;
  this->mOutIndex = (uchar *)&this->mOutIndex;
  this->mHitEnd = false;
  return;
}

Assistant:

void InputAESDecodeStream::Assign(IByteReader* inSourceReader, const ByteList& inKey)
{
	mSourceStream = inSourceReader;

	// convert inEncryptionKey to internal rep and init decrypt [let's hope its 16...]
	mKeyLength = inKey.size();
	mKey = new unsigned char[mKeyLength];
	ByteList::const_iterator it = inKey.begin();
	size_t i = 0;
	for (; it != inKey.end(); ++i, ++it)
		mKey[i] = *it;
	mDecrypt.key(mKey, mKeyLength);
	mIsIvInit = false; // first read flag. still need to read IV
	mReadBlockSize = AES_BLOCK_SIZE;
	mOutIndex = mOut + mReadBlockSize;
	mHitEnd = false;
}